

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,char *path)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  char *pcVar3;
  cmMakefile *this_01;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  bool collapse_02;
  allocator local_d9;
  auto_ptr<cmMakefile> mf;
  string file;
  string local_a8;
  cmStateSnapshot snapshot;
  string homeOutputDir;
  string homeDir;
  
  pcVar1 = this->GlobalGenerator;
  this_00 = pcVar1;
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    this_00 = (cmGlobalGenerator *)operator_new(0x5c8);
    cmGlobalGenerator::cmGlobalGenerator(this_00,this);
  }
  if (path != (char *)0x0) {
    cmState::Reset((cmStateSnapshot *)&file,this->State);
    (this->CurrentSnapshot).Position.Position = file.field_2._M_allocated_capacity;
    (this->CurrentSnapshot).State = (cmState *)file._M_dataplus._M_p;
    (this->CurrentSnapshot).Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)file._M_string_length;
    pcVar3 = GetHomeDirectory(this);
    std::__cxx11::string::string((string *)&homeDir,pcVar3,(allocator *)&file);
    pcVar3 = GetHomeOutputDirectory(this);
    std::__cxx11::string::string((string *)&homeOutputDir,pcVar3,(allocator *)&file);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&file,(SystemTools *)0x1,collapse);
    SetHomeDirectory(this,&file);
    std::__cxx11::string::~string((string *)&file);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&file,(SystemTools *)0x1,collapse_00);
    SetHomeOutputDirectory(this,&file);
    std::__cxx11::string::~string((string *)&file);
    snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
    snapshot.State = (this->CurrentSnapshot).State;
    snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&file,&snapshot);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_a8,(SystemTools *)0x1,collapse_01);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&file,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&file,&snapshot);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_a8,(SystemTools *)0x1,collapse_02);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)&file,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    cmStateSnapshot::SetDefaultDefinitions(&snapshot);
    this_01 = (cmMakefile *)operator_new(0x760);
    cmMakefile::cmMakefile(this_01,this_00,&snapshot);
    mf.x_ = this_01;
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      std::__cxx11::string::string((string *)&local_a8,path,&local_d9);
      cmsys::SystemTools::CollapseFullPath(&file,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      cmsys::SystemTools::ConvertToUnixSlashes(&file);
      cmMakefile::SetScriptModeFile(mf.x_,file._M_dataplus._M_p);
      cmMakefile::SetArgcArgv(mf.x_,args);
      std::__cxx11::string::~string((string *)&file);
    }
    bVar2 = cmMakefile::ReadListFile(mf.x_,path);
    if (!bVar2) {
      cmSystemTools::Error("Error processing file: ",path,(char *)0x0,(char *)0x0);
    }
    SetHomeDirectory(this,&homeDir);
    SetHomeOutputDirectory(this,&homeOutputDir);
    cm::auto_ptr<cmMakefile>::~auto_ptr(&mf);
    std::__cxx11::string::~string((string *)&homeOutputDir);
    std::__cxx11::string::~string((string *)&homeDir);
  }
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    (*this_00->_vptr_cmGlobalGenerator[1])(this_00);
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const char* path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg) {
    gg = new cmGlobalGenerator(this);
    created = true;
  }

  // read in the list file to fill the cache
  if (path) {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.GetDirectory().SetCurrentSource(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.SetDefaultDefinitions();
    CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(gg, snapshot));
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf->SetScriptModeFile(file.c_str());

      mf->SetArgcArgv(args);
    }
    if (!mf->ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: ", path);
    }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
  }

  // free generic one if generated
  if (created) {
    delete gg;
  }
}